

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimulateRound(Aig_Man_t *p0,Aig_Man_t *p1)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = 0;
  do {
    if (p0->vObjs->nSize <= iVar6) {
      for (iVar6 = 0; iVar6 != 0x10; iVar6 = iVar6 + 1) {
        for (iVar7 = 0; iVar7 < p0->vObjs->nSize; iVar7 = iVar7 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,iVar7);
          if (((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)
              ) && ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar3->Id] == (Aig_Obj_t *)0x0)
                    ))) {
            Saig_StrSimulateNode(pAVar3,iVar6);
          }
        }
        for (iVar7 = 0; iVar2 = p0->nRegs, iVar7 < iVar2; iVar7 = iVar7 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,p0->nTruePos + iVar7);
          Saig_StrSimSaveOutput(pAVar3,iVar6);
        }
        if (iVar6 != 0xf) {
          for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
            pAVar3 = Saig_ManLi(p0,iVar7);
            pAVar5 = Saig_ManLo(p0,iVar7);
            Saig_StrSimTransferNext(pAVar3,pAVar5,iVar6);
            iVar2 = p0->nRegs;
          }
        }
        for (iVar7 = 0; iVar7 < p1->vObjs->nSize; iVar7 = iVar7 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,iVar7);
          if (((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)
              ) && ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar3->Id] == (Aig_Obj_t *)0x0)
                    ))) {
            Saig_StrSimulateNode(pAVar3,iVar6);
          }
        }
        for (iVar7 = 0; iVar2 = p1->nRegs, iVar7 < iVar2; iVar7 = iVar7 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p1->vCos,p1->nTruePos + iVar7);
          Saig_StrSimSaveOutput(pAVar3,iVar6);
        }
        if (iVar6 != 0xf) {
          for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
            pAVar3 = Saig_ManLi(p1,iVar7);
            pAVar5 = Saig_ManLo(p1,iVar7);
            Saig_StrSimTransferNext(pAVar3,pAVar5,iVar6);
            iVar2 = p1->nRegs;
          }
        }
      }
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,iVar6);
    if (((pAVar3 != (Aig_Obj_t *)0x0) &&
        (((uVar1 = (uint)*(undefined8 *)&pAVar3->field_0x18, (uVar1 & 7) == 2 ||
          (0xfffffffd < (uVar1 & 7) - 7)) && (p0->pReprs != (Aig_Obj_t **)0x0)))) &&
       (pAVar5 = p0->pReprs[pAVar3->Id], pAVar5 != (Aig_Obj_t *)0x0)) {
      if (p1->pReprs == (Aig_Obj_t **)0x0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = p1->pReprs[pAVar5->Id];
      }
      if (pAVar4 != pAVar3) {
        __assert_fail("Aig_ObjRepr(p1, pObj1) == pObj0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                      ,0x132,"void Saig_StrSimulateRound(Aig_Man_t *, Aig_Man_t *)");
      }
      Saig_StrSimAssignRandom(pAVar3);
      Saig_StrSimTransfer(pAVar3,pAVar5);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void Saig_StrSimulateRound( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int f, i;
    // simulate the nodes
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( !Aig_ObjIsCi(pObj0) && !Aig_ObjIsNode(pObj0) )
           continue;
        pObj1 = Aig_ObjRepr(p0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( Aig_ObjRepr(p1, pObj1) == pObj0 );
        Saig_StrSimAssignRandom( pObj0 );
        Saig_StrSimTransfer( pObj0, pObj1 );
    }
    // simulate the timeframes
    for ( f = 0; f < SAIG_WORDS; f++ )
    {
        // simulate the first AIG
        Aig_ManForEachNode( p0, pObj0, i )
            if ( Aig_ObjRepr(p0, pObj0) == NULL )
                Saig_StrSimulateNode( pObj0, f );
        Saig_ManForEachLi( p0, pObj0, i )
            Saig_StrSimSaveOutput( pObj0, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
                Saig_StrSimTransferNext( pObj0, pObj1, f );
        // simulate the second AIG
        Aig_ManForEachNode( p1, pObj1, i )
            if ( Aig_ObjRepr(p1, pObj1) == NULL )
                Saig_StrSimulateNode( pObj1, f );
        Saig_ManForEachLi( p1, pObj1, i )
            Saig_StrSimSaveOutput( pObj1, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p1, pObj1, pObj0, i )
                Saig_StrSimTransferNext( pObj1, pObj0, f );
    }
}